

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

void __thiscall
httplib::ClientImpl::ClientImpl
          (ClientImpl *this,string *host,int port,string *client_cert_path,string *client_key_path)

{
  string local_a0;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string *local_30;
  string *client_key_path_local;
  string *client_cert_path_local;
  string *psStack_18;
  int port_local;
  string *host_local;
  ClientImpl *this_local;
  
  this->_vptr_ClientImpl = (_func_int **)&PTR__ClientImpl_00216f60;
  local_30 = client_key_path;
  client_key_path_local = client_cert_path;
  client_cert_path_local._4_4_ = port;
  psStack_18 = host;
  host_local = (string *)this;
  std::__cxx11::string::string((string *)&this->host_,(string *)host);
  this->port_ = client_cert_path_local._4_4_;
  adjust_host_string(&local_70,this,psStack_18);
  std::operator+(&local_50,&local_70,":");
  std::__cxx11::to_string(&local_a0,client_cert_path_local._4_4_);
  std::operator+(&this->host_and_port_,&local_50,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  Socket::Socket(&this->socket_);
  std::mutex::mutex(&this->socket_mutex_);
  std::recursive_mutex::recursive_mutex(&this->request_mutex_);
  this->socket_requests_in_flight_ = 0;
  std::thread::id::id(&this->socket_requests_are_from_thread_);
  this->socket_should_be_closed_when_request_is_done_ = false;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&this->addr_map_);
  std::
  multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::multimap(&this->default_headers_);
  std::__cxx11::string::string((string *)&this->client_cert_path_,(string *)client_key_path_local);
  std::__cxx11::string::string((string *)&this->client_key_path_,(string *)local_30);
  this->connection_timeout_sec_ = 300;
  this->connection_timeout_usec_ = 0;
  this->read_timeout_sec_ = 5;
  this->read_timeout_usec_ = 0;
  this->write_timeout_sec_ = 5;
  this->write_timeout_usec_ = 0;
  std::__cxx11::string::string((string *)&this->basic_auth_username_);
  std::__cxx11::string::string((string *)&this->basic_auth_password_);
  std::__cxx11::string::string((string *)&this->bearer_token_auth_token_);
  this->keep_alive_ = false;
  this->follow_location_ = false;
  this->url_encode_ = true;
  this->address_family_ = 0;
  this->tcp_nodelay_ = false;
  std::function<void_(int)>::function(&this->socket_options_,(nullptr_t)0x0);
  this->compress_ = false;
  this->decompress_ = true;
  std::__cxx11::string::string((string *)&this->interface_);
  std::__cxx11::string::string((string *)&this->proxy_host_);
  this->proxy_port_ = -1;
  std::__cxx11::string::string((string *)&this->proxy_basic_auth_username_);
  std::__cxx11::string::string((string *)&this->proxy_basic_auth_password_);
  std::__cxx11::string::string((string *)&this->proxy_bearer_token_auth_token_);
  std::function<void_(const_httplib::Request_&,_const_httplib::Response_&)>::function
            (&this->logger_);
  return;
}

Assistant:

inline ClientImpl::ClientImpl(const std::string &host, int port,
                              const std::string &client_cert_path,
                              const std::string &client_key_path)
    : host_(host), port_(port),
      host_and_port_(adjust_host_string(host) + ":" + std::to_string(port)),
      client_cert_path_(client_cert_path), client_key_path_(client_key_path) {}